

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lb.cpp
# Opt level: O3

void __thiscall zmq::lb_t::attach(lb_t *this,pipe_t *pipe_)

{
  int iVar1;
  pointer pppVar2;
  size_type sVar3;
  pipe_t *ppVar4;
  pipe_t *ppVar5;
  
  array_t<zmq::pipe_t,_2>::push_back(&this->_pipes,pipe_);
  iVar1 = (pipe_->super_array_item_t<2>)._array_index;
  pppVar2 = (this->_pipes)._items.super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar3 = this->_active;
  ppVar4 = pppVar2[iVar1];
  if (ppVar4 != (pipe_t *)0x0) {
    *(int *)((long)&ppVar4->super_array_item_t<2> + 8) = (int)sVar3;
  }
  ppVar5 = pppVar2[sVar3];
  if (ppVar5 != (pipe_t *)0x0) {
    *(int *)((long)&ppVar5->super_array_item_t<2> + 8) = iVar1;
  }
  pppVar2[iVar1] = ppVar5;
  pppVar2[sVar3] = ppVar4;
  this->_active = sVar3 + 1;
  return;
}

Assistant:

void zmq::lb_t::attach (pipe_t *pipe_)
{
    _pipes.push_back (pipe_);
    activated (pipe_);
}